

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void nn_global_term(void)

{
  nn_transport *pnVar1;
  int i;
  nn_transport *tp;
  int local_c;
  
  if (self.socks != (nn_sock **)0x0) {
    if (self.nsocks == 0) {
      nn_pool_term((nn_pool *)0x14d7d1);
      for (local_c = 0; pnVar1 = nn_transports[local_c], pnVar1 != (nn_transport *)0x0;
          local_c = local_c + 1) {
        if (pnVar1->term != (_func_void *)0x0) {
          (*pnVar1->term)();
        }
      }
      nn_free((void *)0x14d823);
      self.socks = (nn_sock **)0x0;
      nn_alloc_term();
    }
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self.socks",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/global.c"
          ,0x114);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_global_term (void)
{
#if defined NN_HAVE_WINDOWS
    int rc;
#endif
    const struct nn_transport *tp;
    int i;

    /*  If there are no sockets remaining, uninitialise the global context. */
    nn_assert (self.socks);
    if (self.nsocks > 0)
        return;

    /*  Shut down the worker threads. */
    nn_pool_term (&self.pool);

    /*  Ask all the transport to deallocate their global resources. */
    for (i = 0; (tp = nn_transports[i]) != NULL; i++) {
        if (tp->term)
            tp->term ();
    }

    /*  Final deallocation of the nn_global object itself. */
    nn_free (self.socks);

    /*  This marks the global state as uninitialised. */
    self.socks = NULL;

    /*  Shut down the memory allocation subsystem. */
    nn_alloc_term ();

    /*  On Windows, uninitialise the socket library. */
#if defined NN_HAVE_WINDOWS
    rc = WSACleanup ();
    nn_assert (rc == 0);
#endif
}